

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvhz.cpp
# Opt level: O3

void UConverter_fromUnicode_HZ_OFFSETS_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  UChar UVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  long lVar4;
  uint uVar5;
  UConverter *pUVar6;
  ulong uVar7;
  ulong uVar8;
  uint8_t uVar9;
  int32_t *piVar10;
  uint8_t uVar11;
  uint uVar12;
  char cVar13;
  int32_t iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint32_t local_78;
  char local_71;
  ulong local_70;
  char *local_68;
  ulong local_60;
  ulong local_58;
  UErrorCode *local_50;
  long *local_48;
  ulong local_40;
  UChar *local_38;
  
  local_38 = args->source;
  local_68 = args->target;
  piVar10 = args->offsets;
  iVar17 = *(int *)&args->targetLimit - (int)local_68;
  local_70 = (ulong)((long)args->sourceLimit - (long)local_38) >> 1;
  pUVar6 = args->converter;
  local_48 = (long *)pUVar6->extraInfo;
  local_71 = *(char *)((long)local_48 + 0x12);
  local_50 = err;
  if ((pUVar6->fromUChar32 == 0) || (uVar12 = 0, iVar17 < 1)) {
    if ((int)(uint)local_70 < 1) {
      iVar15 = 0;
      iVar16 = 0;
    }
    else {
      local_40 = (ulong)((uint)local_70 & 0x7fffffff);
      local_60 = 0;
      uVar7 = 0;
      do {
        uVar7 = uVar7 & 0xffffffff;
        uVar8 = (long)(int)local_60;
        while( true ) {
          local_78 = 0xffff;
          iVar15 = (int)uVar7;
          iVar14 = (int32_t)uVar8;
          if (iVar17 <= iVar15) {
            *local_50 = U_BUFFER_OVERFLOW_ERROR;
            iVar16 = iVar14;
            goto LAB_002bea9e;
          }
          local_60 = uVar8 + 1;
          UVar1 = local_38[uVar8];
          local_58 = (ulong)(ushort)UVar1;
          uVar12 = (uint)(ushort)UVar1;
          uVar5 = (uint)(ushort)UVar1;
          if (uVar5 != 0x7e) break;
          lVar4 = 0;
          do {
            uVar9 = "~~"[lVar4];
            iVar16 = (int)uVar7;
            if (iVar16 < iVar17) {
              args->target[iVar16] = uVar9;
              if (args->offsets != (int32_t *)0x0) {
                *piVar10 = iVar14;
                piVar10 = piVar10 + 1;
              }
              uVar7 = (ulong)(iVar16 + 1);
            }
            else {
              pUVar6 = args->converter;
              cVar13 = pUVar6->charErrorBufferLength;
              pUVar6->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar9;
              *local_50 = U_BUFFER_OVERFLOW_ERROR;
            }
            iVar15 = (int)uVar7;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 2);
          uVar8 = local_60;
          if ((long)local_40 <= (long)local_60) goto LAB_002bea7f;
        }
        cVar13 = local_71;
        if (0x7f < (ushort)UVar1) {
          iVar3 = ucnv_MBCSFromUChar32_63
                            (*(UConverterSharedData **)(*local_48 + 0x30),(uint)(ushort)UVar1,
                             &local_78,args->converter->useFallback);
          uVar12 = (uint)local_58;
          if (((iVar3 == 2) && ((local_78 + 0x5e5f & 0xfffe) < 0x5c5e)) &&
             ((local_78 + 0x5f & 0xfe) < 0x5e)) {
            uVar5 = local_78 - 0x8080;
            cVar13 = local_71;
            goto LAB_002be853;
          }
LAB_002beac2:
          UVar2 = U_INVALID_CHAR_FOUND;
          if (((uVar12 & 0xf800) != 0xd800) ||
             (UVar2 = U_ILLEGAL_CHAR_FOUND, (uVar12 >> 10 & 1) != 0)) goto LAB_002bea75;
          pUVar6 = args->converter;
          pUVar6->fromUChar32 = uVar12;
          uVar5 = uVar12;
          goto LAB_002be6b5;
        }
LAB_002be853:
        local_71 = cVar13;
        if (uVar5 == 0xffff) goto LAB_002beac2;
        local_71 = 0xff < uVar5;
        *(char *)((long)local_48 + 0x12) = local_71;
        if (((int)cVar13 != (uint)(byte)local_71) || ((char)local_48[2] == '\0')) {
          lVar4 = 0;
          if (uVar5 < 0x100) {
            do {
              uVar9 = "~}"[lVar4];
              iVar16 = (int)uVar7;
              if (iVar16 < iVar17) {
                args->target[iVar16] = uVar9;
                if (args->offsets != (int32_t *)0x0) {
                  *piVar10 = iVar14;
                  piVar10 = piVar10 + 1;
                }
                uVar7 = (ulong)(iVar16 + 1);
              }
              else {
                pUVar6 = args->converter;
                cVar13 = pUVar6->charErrorBufferLength;
                pUVar6->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
                *local_50 = U_BUFFER_OVERFLOW_ERROR;
              }
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 2);
          }
          else {
            do {
              uVar9 = "~{"[lVar4];
              iVar16 = (int)uVar7;
              if (iVar16 < iVar17) {
                args->target[iVar16] = uVar9;
                if (args->offsets != (int32_t *)0x0) {
                  *piVar10 = iVar14;
                  piVar10 = piVar10 + 1;
                }
                uVar7 = (ulong)(iVar16 + 1);
              }
              else {
                pUVar6 = args->converter;
                cVar13 = pUVar6->charErrorBufferLength;
                pUVar6->charErrorBufferLength = cVar13 + '\x01';
                pUVar6->charErrorBuffer[cVar13] = uVar9;
                *local_50 = U_BUFFER_OVERFLOW_ERROR;
              }
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 != 2);
          }
          *(undefined1 *)(local_48 + 2) = 1;
        }
        iVar16 = (int)local_60;
        iVar15 = (int)uVar7;
        uVar9 = (uint8_t)uVar5;
        if (uVar5 < 0x100) {
          if (iVar15 < iVar17) {
            uVar7 = (ulong)(iVar15 + 1);
            local_68[iVar15] = uVar9;
            if (piVar10 == (int32_t *)0x0) {
              piVar10 = (int32_t *)0x0;
            }
            else {
              *piVar10 = iVar14;
              piVar10 = piVar10 + 1;
            }
            goto LAB_002bea12;
          }
          pUVar6 = args->converter;
          cVar13 = pUVar6->charErrorBufferLength;
          pUVar6->charErrorBufferLength = cVar13 + '\x01';
          pUVar6->charErrorBuffer[cVar13] = uVar9;
LAB_002bea03:
          *local_50 = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          uVar11 = (uint8_t)(uVar5 >> 8);
          if (iVar17 <= iVar15) {
            pUVar6 = args->converter;
            cVar13 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar13 + '\x01';
            pUVar6->charErrorBuffer[cVar13] = uVar11;
            pUVar6 = args->converter;
            cVar13 = pUVar6->charErrorBufferLength;
            pUVar6->charErrorBufferLength = cVar13 + '\x01';
            pUVar6->charErrorBuffer[cVar13] = uVar9;
            goto LAB_002bea03;
          }
          local_68[iVar15] = uVar11;
          uVar8 = (long)iVar15 + 1;
          if (piVar10 == (int32_t *)0x0) {
            if (iVar17 <= (int)uVar8) {
              piVar10 = (int32_t *)0x0;
              goto LAB_002bea55;
            }
            local_68[uVar8] = uVar9;
            uVar7 = (ulong)(iVar15 + 2);
            piVar10 = (int32_t *)0x0;
          }
          else {
            *piVar10 = iVar14;
            if ((int)uVar8 < iVar17) {
              uVar7 = (ulong)(iVar15 + 2);
              local_68[uVar8] = uVar9;
              piVar10[1] = iVar14;
              piVar10 = piVar10 + 2;
            }
            else {
              piVar10 = piVar10 + 1;
LAB_002bea55:
              pUVar6 = args->converter;
              cVar13 = pUVar6->charErrorBufferLength;
              pUVar6->charErrorBufferLength = cVar13 + '\x01';
              pUVar6->charErrorBuffer[cVar13] = uVar9;
              *local_50 = U_BUFFER_OVERFLOW_ERROR;
              uVar7 = uVar8;
            }
          }
        }
LAB_002bea12:
        iVar15 = (int)uVar7;
      } while (iVar16 < (int)local_70);
    }
  }
  else {
    iVar15 = 0;
    local_60 = 0;
    uVar5 = pUVar6->fromUChar32;
LAB_002be6b5:
    UVar2 = U_ZERO_ERROR;
    iVar17 = (int)local_60;
    if (iVar17 < (int)local_70) {
      UVar2 = U_ILLEGAL_CHAR_FOUND;
      if (((ushort)args->source[iVar17] & 0xfc00) == 0xdc00) {
        local_60 = (ulong)(iVar17 + 1);
        uVar12 = uVar5 * 0x400 + (uint)(ushort)args->source[iVar17] + 0xfca02400;
        pUVar6->fromUChar32 = 0;
        UVar2 = U_INVALID_CHAR_FOUND;
      }
    }
LAB_002bea75:
    *local_50 = UVar2;
    args->converter->fromUChar32 = uVar12;
LAB_002bea7f:
    iVar16 = (int)local_60;
  }
LAB_002bea9e:
  args->target = args->target + iVar15;
  args->source = args->source + iVar16;
  *(char *)((long)local_48 + 0x12) = local_71;
  return;
}

Assistant:

static void  U_CALLCONV
UConverter_fromUnicode_HZ_OFFSETS_LOGIC (UConverterFromUnicodeArgs * args,
                                                      UErrorCode * err){
    const UChar *mySource = args->source;
    char *myTarget = args->target;
    int32_t* offsets = args->offsets;
    int32_t mySourceIndex = 0;
    int32_t myTargetIndex = 0;
    int32_t targetLength = (int32_t)(args->targetLimit - myTarget);
    int32_t mySourceLength = (int32_t)(args->sourceLimit - args->source);
    uint32_t targetUniChar = 0x0000;
    UChar32 mySourceChar = 0x0000;
    UConverterDataHZ *myConverterData=(UConverterDataHZ*)args->converter->extraInfo;
    UBool isTargetUCharDBCS = (UBool) myConverterData->isTargetUCharDBCS;
    UBool oldIsTargetUCharDBCS;
    int len =0;
    const char* escSeq=NULL;
    
    /* Calling code already handles this situation. */
    /*if ((args->converter == NULL) || (args->targetLimit < myTarget) || (args->sourceLimit < args->source)){
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }*/
    if(args->converter->fromUChar32!=0 && myTargetIndex < targetLength) {
        goto getTrail;
    }
    /*writing the char to the output stream */
    while (mySourceIndex < mySourceLength){
        targetUniChar = missingCharMarker;
        if (myTargetIndex < targetLength){
            
            mySourceChar = (UChar) mySource[mySourceIndex++];
            

            oldIsTargetUCharDBCS = isTargetUCharDBCS;
            if(mySourceChar ==UCNV_TILDE){
                /*concatEscape(args, &myTargetIndex, &targetLength,"\x7E\x7E",err,2,&mySourceIndex);*/
                len = ESC_LEN;
                escSeq = TILDE_ESCAPE;
                CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                continue;
            } else if(mySourceChar <= 0x7f) {
                targetUniChar = mySourceChar;
            } else {
                int32_t length= ucnv_MBCSFromUChar32(myConverterData->gbConverter->sharedData,
                    mySourceChar,&targetUniChar,args->converter->useFallback);
                /* we can only use lead bytes 21..7D and trail bytes 21..7E */
                if( length == 2 &&
                    (uint16_t)(targetUniChar - 0xa1a1) <= (0xfdfe - 0xa1a1) &&
                    (uint8_t)(targetUniChar - 0xa1) <= (0xfe - 0xa1)
                ) {
                    targetUniChar -= 0x8080;
                } else {
                    targetUniChar = missingCharMarker;
                }
            }
            if (targetUniChar != missingCharMarker){
               myConverterData->isTargetUCharDBCS = isTargetUCharDBCS = (UBool)(targetUniChar>0x00FF);     
                 if(oldIsTargetUCharDBCS != isTargetUCharDBCS || !myConverterData->isEscapeAppended ){
                    /*Shifting from a double byte to single byte mode*/
                    if(!isTargetUCharDBCS){
                        len =ESC_LEN;
                        escSeq = SB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                    }
                    else{ /* Shifting from a single byte to double byte mode*/
                        len =ESC_LEN;
                        escSeq = DB_ESCAPE;
                        CONCAT_ESCAPE_MACRO(args, myTargetIndex, targetLength, escSeq,err,len,mySourceIndex);
                        myConverterData->isEscapeAppended = TRUE;
                        
                    }
                }
            
                if(isTargetUCharDBCS){
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] =(char) (targetUniChar >> 8);
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        if(myTargetIndex < targetLength){
                            myTarget[myTargetIndex++] =(char) targetUniChar;
                            if(offsets){
                                *(offsets++) = mySourceIndex-1;
                            }
                        }else{
                            args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                            *err = U_BUFFER_OVERFLOW_ERROR;
                        } 
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] =(char) (targetUniChar >> 8);
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }

                }else{
                    if( myTargetIndex <targetLength){
                        myTarget[myTargetIndex++] = (char) (targetUniChar );
                        if(offsets){
                            *(offsets++) = mySourceIndex-1;
                        }
                        
                    }else{
                        args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = (char) targetUniChar;
                        *err = U_BUFFER_OVERFLOW_ERROR;
                    }
                }

            }
            else{
                /* oops.. the code point is unassigned */
                /*Handle surrogates */
                /*check if the char is a First surrogate*/
                if(U16_IS_SURROGATE(mySourceChar)) {
                    if(U16_IS_SURROGATE_LEAD(mySourceChar)) {
                        args->converter->fromUChar32=mySourceChar;
getTrail:
                        /*look ahead to find the trail surrogate*/
                        if(mySourceIndex <  mySourceLength) {
                            /* test the following code unit */
                            UChar trail=(UChar) args->source[mySourceIndex];
                            if(U16_IS_TRAIL(trail)) {
                                ++mySourceIndex;
                                mySourceChar=U16_GET_SUPPLEMENTARY(args->converter->fromUChar32, trail);
                                args->converter->fromUChar32=0x00;
                                /* there are no surrogates in GB2312*/
                                *err = U_INVALID_CHAR_FOUND;
                                /* exit this condition tree */
                            } else {
                                /* this is an unmatched lead code unit (1st surrogate) */
                                /* callback(illegal) */
                                *err=U_ILLEGAL_CHAR_FOUND;
                            }
                        } else {
                            /* no more input */
                            *err = U_ZERO_ERROR;
                        }
                    } else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err=U_ILLEGAL_CHAR_FOUND;
                    }
                } else {
                    /* callback(unassigned) for a BMP code point */
                    *err = U_INVALID_CHAR_FOUND;
                }

                args->converter->fromUChar32=mySourceChar;
                break;
            }
        }
        else{
            *err = U_BUFFER_OVERFLOW_ERROR;
            break;
        }
        targetUniChar=missingCharMarker;
    }

    args->target += myTargetIndex;
    args->source += mySourceIndex;
    myConverterData->isTargetUCharDBCS = isTargetUCharDBCS;
}